

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O0

int jac(N_Vector y,N_Vector f,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  realtype x8;
  realtype x7;
  realtype x6;
  realtype x5;
  realtype x4;
  realtype x3;
  realtype x2;
  realtype x1;
  realtype *yd;
  int i;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector f_local;
  N_Vector y_local;
  
  pdVar9 = (double *)N_VGetArrayPointer_Serial(y);
  dVar1 = *pdVar9;
  dVar2 = pdVar9[1];
  dVar3 = pdVar9[2];
  dVar4 = pdVar9[3];
  dVar5 = pdVar9[4];
  dVar6 = pdVar9[5];
  dVar7 = pdVar9[6];
  dVar8 = pdVar9[7];
  *(double *)**(undefined8 **)((long)J->content + 0x20) = dVar3 * 0.004731 + -0.1238;
  **(double **)(*(long *)((long)J->content + 0x20) + 8) = dVar3 * -0.3578 + -0.001637;
  **(double **)(*(long *)((long)J->content + 0x20) + 0x10) = dVar1 * 0.004731 + -(dVar2 * 0.3578);
  **(undefined8 **)(*(long *)((long)J->content + 0x20) + 0x18) = 0xbfede1b089a02752;
  **(undefined8 **)(*(long *)((long)J->content + 0x20) + 0x30) = 0x3ff0000000000000;
  *(double *)(**(long **)((long)J->content + 0x20) + 8) = dVar3 * 0.2238 + 0.2638;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) = dVar3 * 0.7623 + -0.07745;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 8) =
       dVar1 * 0.2238 + dVar2 * 0.7623;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x18) + 8) = 0xbfe58c7e28240b78;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x30) + 8) = 0xbff0000000000000;
  *(undefined8 *)(**(long **)((long)J->content + 0x20) + 0x10) = 0x3fd6e631f8a0902e;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x10) = 0x3f7360d0247021d1;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x28) + 0x10) = dVar8;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x38) + 0x10) = dVar6;
  *(undefined8 *)(**(long **)((long)J->content + 0x20) + 0x18) = 0xbfe864c2f837b4a2;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x18) = 0x3fcca57a786c2268;
  *(double *)(**(long **)((long)J->content + 0x20) + 0x20) = dVar1 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x20) = dVar2 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 0x28) = dVar3 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x18) + 0x28) = dVar4 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x20) + 0x30) = dVar5 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x28) + 0x30) = dVar6 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x30) + 0x38) = dVar7 * 2.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x38) + 0x38) = dVar8 * 2.0;
  for (yd._4_4_ = 1; yd._4_4_ < 9; yd._4_4_ = yd._4_4_ + 1) {
    *(undefined8 *)
     (*(long *)(*(long *)((long)J->content + 0x20) + (long)(yd._4_4_ + -1) * 8) +
     (long)(yd._4_4_ + 7) * 8) = 0xbff0000000000000;
    *(undefined8 *)
     (*(long *)(*(long *)((long)J->content + 0x20) + (long)(yd._4_4_ + 7) * 8) +
     (long)(yd._4_4_ + 7) * 8) = 0x3ff0000000000000;
  }
  for (yd._4_4_ = 1; yd._4_4_ < 9; yd._4_4_ = yd._4_4_ + 1) {
    *(undefined8 *)
     (*(long *)(*(long *)((long)J->content + 0x20) + (long)(yd._4_4_ + -1) * 8) +
     (long)(yd._4_4_ + 0xf) * 8) = 0x3ff0000000000000;
    *(undefined8 *)
     (*(long *)(*(long *)((long)J->content + 0x20) + (long)(yd._4_4_ + 0xf) * 8) +
     (long)(yd._4_4_ + 0xf) * 8) = 0x3ff0000000000000;
  }
  return 0;
}

Assistant:

static int jac(N_Vector y, N_Vector f,SUNMatrix J,
               void *user_data, N_Vector tmp1, N_Vector tmp2)
{
  int i;
  realtype *yd;
  realtype x1, x2, x3, x4, x5, x6, x7, x8;

  yd = N_VGetArrayPointer_Serial(y);

  x1 = yd[0];
  x2 = yd[1];
  x3 = yd[2];
  x4 = yd[3];
  x5 = yd[4];
  x6 = yd[5];
  x7 = yd[6];
  x8 = yd[7];

  /* Nonlinear equations */

  /* 
     - 0.1238*x1 + x7 - 0.001637*x2 
     - 0.9338*x4 + 0.004731*x1*x3 - 0.3578*x2*x3 - 0.3571 
  */
  IJth(J,1,1) = - 0.1238 + 0.004731*x3;
  IJth(J,1,2) = - 0.001637 - 0.3578*x3;
  IJth(J,1,3) = 0.004731*x1 - 0.3578*x2;
  IJth(J,1,4) = - 0.9338;
  IJth(J,1,7) = 1.0;

  /*
    0.2638*x1 - x7 - 0.07745*x2 
    - 0.6734*x4 + 0.2238*x1*x3 + 0.7623*x2*x3 - 0.6022
  */
  IJth(J,2,1) = 0.2638 + 0.2238*x3;
  IJth(J,2,2) = - 0.07745 + 0.7623*x3;
  IJth(J,2,3) = 0.2238*x1 + 0.7623*x2;
  IJth(J,2,4) = - 0.6734;
  IJth(J,2,7) = -1.0;

  /*
    0.3578*x1 + 0.004731*x2 + x6*x8
  */
  IJth(J,3,1) = 0.3578;
  IJth(J,3,2) = 0.004731;
  IJth(J,3,6) = x8;
  IJth(J,3,8) = x6;

  /*
    - 0.7623*x1 + 0.2238*x2 + 0.3461
  */
  IJth(J,4,1) = - 0.7623;
  IJth(J,4,2) = 0.2238;

  /*
    x1*x1 + x2*x2 - 1
  */
  IJth(J,5,1) = 2.0*x1;
  IJth(J,5,2) = 2.0*x2;

  /*
    x3*x3 + x4*x4 - 1
  */
  IJth(J,6,3) = 2.0*x3;
  IJth(J,6,4) = 2.0*x4;

  /*
    x5*x5 + x6*x6 - 1
  */
  IJth(J,7,5) = 2.0*x5;
  IJth(J,7,6) = 2.0*x6;

  /*
    x7*x7 + x8*x8 - 1
  */
  IJth(J,8,7) = 2.0*x7;
  IJth(J,8,8) = 2.0*x8;

  
  /*
    Lower bounds ( l_i = 1 + x_i >= 0)
    l_i - 1.0 - x_i
   */

  for(i=1;i<=8;i++) {
    IJth(J,8+i,i)   = -1.0;
    IJth(J,8+i,8+i) =  1.0;
  }

  /*
    Upper bounds ( u_i = 1 - x_i >= 0)
    u_i - 1.0 + x_i
   */

  for(i=1;i<=8;i++) {
    IJth(J,16+i,i)    = 1.0;
    IJth(J,16+i,16+i) = 1.0;
  }

  return(0);

}